

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entries.hpp
# Opt level: O2

size_t binlog::
       serializeSizePrefixedTagged<binlog::ClockSync,binlog::detail::RecoverableVectorOutputStream>
                 (ClockSync *entry,RecoverableVectorOutputStream *out)

{
  size_t sVar1;
  uint t;
  
  sVar1 = mserialize::
          StructSerializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
          ::serialized_size(entry);
  t = (int)sVar1 + 8;
  mserialize::detail::TrivialSerializer<unsigned_int>::
  serialize<binlog::detail::RecoverableVectorOutputStream>(t,out);
  mserialize::detail::TrivialSerializer<unsigned_long>::
  serialize<binlog::detail::RecoverableVectorOutputStream>(0xfffffffffffffffd,out);
  mserialize::
  StructSerializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(entry,out);
  return (ulong)t + 4;
}

Assistant:

std::size_t serializeSizePrefixedTagged(const Entry& entry, OutputStream& out)
{
  const std::uint64_t tag = Entry::Tag;
  const std::uint32_t size = std::uint32_t(mserialize::serialized_size(entry) + sizeof(tag));
  mserialize::serialize(size, out);
  mserialize::serialize(tag, out);
  mserialize::serialize(entry, out);

  return size + sizeof(size);
}